

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O1

void av1_calc_proj_params_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 in_XMM1 [16];
  long lVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  undefined1 in_XMM3 [16];
  long lVar15;
  int iVar16;
  int iVar21;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar23;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar24;
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (params->r[0] < 1) {
LAB_00428806:
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar12 = (undefined1  [16])0x0;
      lVar6 = 0;
      lVar11 = 0;
    }
    else {
      lVar6 = 0;
      lVar11 = 0;
      uVar3 = 0;
      auVar12 = (undefined1  [16])0x0;
      do {
        if (0 < width) {
          lVar14 = 0;
          do {
            auVar18 = pmovzxbd(in_XMM3,*(undefined4 *)(dat8 + lVar14));
            auVar17 = pmovzxbd(in_XMM1,*(undefined4 *)(src8 + lVar14));
            piVar1 = flt1 + lVar14;
            auVar20._0_4_ = *piVar1 + auVar18._0_4_ * -0x10;
            auVar20._4_4_ = piVar1[1] + auVar18._4_4_ * -0x10;
            auVar20._8_4_ = piVar1[2] + auVar18._8_4_ * -0x10;
            auVar20._12_4_ = piVar1[3] + auVar18._12_4_ * -0x10;
            auVar9._0_4_ = (auVar17._0_4_ - auVar18._0_4_) * 0x10;
            auVar9._4_4_ = (auVar17._4_4_ - auVar18._4_4_) * 0x10;
            auVar9._8_4_ = (auVar17._8_4_ - auVar18._8_4_) * 0x10;
            auVar9._12_4_ = (auVar17._12_4_ - auVar18._12_4_) * 0x10;
            auVar17 = pmuldq(auVar20,auVar20);
            in_XMM3._0_8_ = auVar17._0_8_ + lVar6;
            in_XMM3._8_8_ = auVar17._8_8_ + lVar11;
            auVar18._4_4_ = auVar20._4_4_;
            auVar18._0_4_ = auVar20._4_4_;
            auVar18._8_4_ = auVar20._12_4_;
            auVar18._12_4_ = auVar20._12_4_;
            auVar25 = pmuldq(auVar20,auVar9);
            auVar10._4_4_ = 0;
            auVar10._0_4_ = auVar9._4_4_;
            auVar10._8_8_ = auVar9._8_8_ >> 0x20;
            auVar28 = pmuldq(auVar10,auVar18);
            auVar17 = pmuldq(auVar18,auVar18);
            lVar6 = auVar17._0_8_ + in_XMM3._0_8_;
            lVar11 = auVar17._8_8_ + in_XMM3._8_8_;
            in_XMM1._0_8_ = auVar28._0_8_ + auVar25._0_8_ + auVar12._0_8_;
            in_XMM1._8_8_ = auVar28._8_8_ + auVar25._8_8_ + auVar12._8_8_;
            lVar14 = lVar14 + 4;
            auVar12 = in_XMM1;
          } while (lVar14 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
        in_XMM1 = auVar12;
      } while (uVar3 != (uint)height);
    }
    *C = 0;
    C[1] = auVar12._8_8_ + auVar12._0_8_;
    H[1][0] = 0;
    H[1][1] = lVar11 + lVar6;
    lVar11 = (long)(height * width);
    H[1][1] = H[1][1] / lVar11;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < params->r[0]) {
        if (height < 1) {
          auVar12 = (undefined1  [16])0x0;
          lVar6 = 0;
          lVar11 = 0;
        }
        else {
          lVar6 = 0;
          lVar11 = 0;
          uVar3 = 0;
          auVar12 = (undefined1  [16])0x0;
          do {
            if (0 < width) {
              lVar14 = 0;
              do {
                auVar18 = pmovzxbd(in_XMM3,*(undefined4 *)(dat8 + lVar14));
                auVar17 = pmovzxbd(in_XMM1,*(undefined4 *)(src8 + lVar14));
                piVar1 = flt0 + lVar14;
                auVar19._0_4_ = *piVar1 + auVar18._0_4_ * -0x10;
                auVar19._4_4_ = piVar1[1] + auVar18._4_4_ * -0x10;
                auVar19._8_4_ = piVar1[2] + auVar18._8_4_ * -0x10;
                auVar19._12_4_ = piVar1[3] + auVar18._12_4_ * -0x10;
                auVar7._0_4_ = (auVar17._0_4_ - auVar18._0_4_) * 0x10;
                auVar7._4_4_ = (auVar17._4_4_ - auVar18._4_4_) * 0x10;
                auVar7._8_4_ = (auVar17._8_4_ - auVar18._8_4_) * 0x10;
                auVar7._12_4_ = (auVar17._12_4_ - auVar18._12_4_) * 0x10;
                auVar17 = pmuldq(auVar19,auVar19);
                in_XMM3._0_8_ = auVar17._0_8_ + lVar6;
                in_XMM3._8_8_ = auVar17._8_8_ + lVar11;
                auVar5._4_4_ = auVar19._4_4_;
                auVar5._0_4_ = auVar19._4_4_;
                auVar5._8_4_ = auVar19._12_4_;
                auVar5._12_4_ = auVar19._12_4_;
                auVar28 = pmuldq(auVar19,auVar7);
                auVar8._4_4_ = 0;
                auVar8._0_4_ = auVar7._4_4_;
                auVar8._8_8_ = auVar7._8_8_ >> 0x20;
                auVar18 = pmuldq(auVar8,auVar5);
                auVar17 = pmuldq(auVar5,auVar5);
                lVar6 = auVar17._0_8_ + in_XMM3._0_8_;
                lVar11 = auVar17._8_8_ + in_XMM3._8_8_;
                in_XMM1._0_8_ = auVar18._0_8_ + auVar28._0_8_ + auVar12._0_8_;
                in_XMM1._8_8_ = auVar18._8_8_ + auVar28._8_8_ + auVar12._8_8_;
                lVar14 = lVar14 + 4;
                auVar12 = in_XMM1;
              } while (lVar14 < width);
            }
            uVar3 = uVar3 + 1;
            flt0 = flt0 + flt0_stride;
            src8 = src8 + src_stride;
            dat8 = dat8 + dat_stride;
            in_XMM1 = auVar12;
          } while (uVar3 != (uint)height);
        }
        *C = auVar12._8_8_ + auVar12._0_8_;
        C[1] = 0;
        (*H)[0] = lVar11 + lVar6;
        (*H)[1] = 0;
        lVar11 = (long)(height * width);
        (*H)[0] = (*H)[0] / lVar11;
        goto LAB_0042890a;
      }
      goto LAB_00428806;
    }
    lVar24 = 0;
    lVar26 = 0;
    auVar17 = (undefined1  [16])0x0;
    auVar12 = (undefined1  [16])0x0;
    lVar14 = 0;
    lVar15 = 0;
    lVar6 = 0;
    lVar11 = 0;
    if (0 < height) {
      uVar3 = 0;
      auVar17 = (undefined1  [16])0x0;
      lVar24 = 0;
      lVar26 = 0;
      do {
        if (0 < width) {
          lVar4 = 0;
          do {
            auVar18 = pmovzxbd(auVar17,*(undefined4 *)(dat8 + lVar4));
            auVar28 = pmovzxbd(in_XMM9,*(undefined4 *)(src8 + lVar4));
            piVar1 = flt0 + lVar4;
            piVar2 = flt1 + lVar4;
            iVar16 = auVar18._0_4_;
            iVar21 = auVar18._4_4_;
            iVar22 = auVar18._8_4_;
            iVar23 = auVar18._12_4_;
            in_XMM9._0_4_ = (auVar28._0_4_ - iVar16) * 0x10;
            in_XMM9._4_4_ = (auVar28._4_4_ - iVar21) * 0x10;
            in_XMM9._8_4_ = (auVar28._8_4_ - iVar22) * 0x10;
            in_XMM9._12_4_ = (auVar28._12_4_ - iVar23) * 0x10;
            auVar29._0_4_ = *piVar1 + iVar16 * -0x10;
            auVar29._4_4_ = piVar1[1] + iVar21 * -0x10;
            auVar29._8_4_ = piVar1[2] + iVar22 * -0x10;
            auVar29._12_4_ = piVar1[3] + iVar23 * -0x10;
            auVar27._0_4_ = *piVar2 + iVar16 * -0x10;
            auVar27._4_4_ = piVar2[1] + iVar21 * -0x10;
            auVar27._8_4_ = piVar2[2] + iVar22 * -0x10;
            auVar27._12_4_ = piVar2[3] + iVar23 * -0x10;
            auVar25 = pmuldq(auVar29,auVar29);
            auVar28._4_4_ = auVar29._4_4_;
            auVar28._0_4_ = auVar29._4_4_;
            auVar28._8_4_ = auVar29._12_4_;
            auVar28._12_4_ = auVar29._12_4_;
            auVar18 = pmuldq(auVar28,auVar28);
            lVar6 = auVar18._0_8_ + auVar25._0_8_ + lVar6;
            lVar11 = auVar18._8_8_ + auVar25._8_8_ + lVar11;
            auVar30 = pmuldq(auVar27,auVar29);
            auVar25._4_4_ = auVar27._4_4_;
            auVar25._0_4_ = auVar27._4_4_;
            auVar25._8_4_ = auVar27._12_4_;
            auVar25._12_4_ = auVar27._12_4_;
            auVar18 = pmuldq(auVar25,auVar28);
            lVar14 = auVar18._0_8_ + auVar30._0_8_ + lVar14;
            lVar15 = auVar18._8_8_ + auVar30._8_8_ + lVar15;
            auVar30 = pmuldq(auVar27,auVar27);
            lVar13 = auVar12._8_8_;
            auVar18 = pmuldq(auVar25,auVar25);
            auVar12._0_8_ = auVar18._0_8_ + auVar30._0_8_ + auVar12._0_8_;
            auVar12._8_8_ = auVar18._8_8_ + auVar30._8_8_ + lVar13;
            auVar29 = pmuldq(auVar29,in_XMM9);
            lVar13 = auVar17._8_8_;
            auVar30._4_4_ = in_XMM9._4_4_;
            auVar30._0_4_ = in_XMM9._4_4_;
            auVar30._8_4_ = in_XMM9._12_4_;
            auVar30._12_4_ = in_XMM9._12_4_;
            auVar18 = pmuldq(auVar28,auVar30);
            auVar17._0_8_ = auVar18._0_8_ + auVar29._0_8_ + auVar17._0_8_;
            auVar17._8_8_ = auVar18._8_8_ + auVar29._8_8_ + lVar13;
            auVar28 = pmuldq(auVar27,in_XMM9);
            auVar18 = pmuldq(auVar25,auVar30);
            lVar24 = auVar18._0_8_ + auVar28._0_8_ + lVar24;
            lVar26 = auVar18._8_8_ + auVar28._8_8_ + lVar26;
            lVar4 = lVar4 + 4;
          } while (lVar4 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar3 != (uint)height);
    }
    auVar18 = pblendw((undefined1  [16])0x0,auVar12,0xf0);
    *C = auVar17._8_8_ + auVar17._0_8_;
    C[1] = lVar26 + lVar24;
    (*H)[0] = lVar11 + lVar6;
    (*H)[1] = lVar15 + lVar14;
    H[1][0] = auVar18._0_8_;
    H[1][1] = auVar12._0_8_ + auVar18._8_8_;
    lVar11 = (long)(height * width);
    lVar6 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar11;
    lVar6 = lVar6 / lVar11;
    (*H)[1] = lVar6;
    H[1][1] = H[1][1] / lVar11;
    H[1][0] = lVar6;
    *C = *C / lVar11;
  }
  C = C + 1;
LAB_0042890a:
  *C = *C / lVar11;
  return;
}

Assistant:

void av1_calc_proj_params_sse4_1(const uint8_t *src8, int width, int height,
                                 int src_stride, const uint8_t *dat8,
                                 int dat_stride, int32_t *flt0, int flt0_stride,
                                 int32_t *flt1, int flt1_stride,
                                 int64_t H[2][2], int64_t C[2],
                                 const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_sse4_1(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, flt1,
                                  flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt1, flt1_stride, H, C);
  }
}